

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O2

IncrementalStateType * __thiscall
perfetto::DataSource<perfetto::TrackEvent,_perfetto::internal::TrackEventDataSourceTraits>::
TraceContext::GetIncrementalState(TraceContext *this)

{
  DataSourceInstanceThreadLocalState *pDVar1;
  
  pDVar1 = this->tls_inst_;
  if ((__atomic_base<unsigned_int>)pDVar1->incremental_state_generation !=
      static_state_.incremental_state_generation.super___atomic_base<unsigned_int>._M_i) {
    ::std::__uniq_ptr_impl<void,_void_(*)(void_*)>::reset
              ((__uniq_ptr_impl<void,_void_(*)(void_*)> *)&pDVar1->incremental_state,(pointer)0x0);
    CreateIncrementalState(this->tls_inst_);
    pDVar1 = this->tls_inst_;
  }
  return (IncrementalStateType *)
         (pDVar1->incremental_state)._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
         _M_head_impl;
}

Assistant:

typename DataSourceTraits::IncrementalStateType* GetIncrementalState() {
      // Recreate incremental state data if it has been reset by the service.
      if (tls_inst_->incremental_state_generation !=
          static_state_.incremental_state_generation.load(
              std::memory_order_relaxed)) {
        tls_inst_->incremental_state.reset();
        CreateIncrementalState(tls_inst_);
      }
      return reinterpret_cast<typename DataSourceTraits::IncrementalStateType*>(
          tls_inst_->incremental_state.get());
    }